

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_name.c
# Opt level: O1

int pull_by_name(char *input_file,FILE *names_fp,int min,int max,int length,int exclude,int convert,
                int just_count)

{
  kstring_t *str;
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  kseq_t *seq;
  kstream_t *pkVar4;
  uchar *puVar5;
  lookup_t *plVar6;
  uint extraout_var;
  ulong uVar7;
  uint uVar8;
  size_t __size;
  kstring_t *str_00;
  char **unaff_R12;
  uint uVar9;
  char *line;
  uint uStackY_7c;
  ulong uStackY_78;
  char **ppcStackY_70;
  char *pcStackY_68;
  FILE *pFStackY_60;
  char *local_40;
  gzFile local_38;
  
  pFStackY_60 = (FILE *)0x10414e;
  local_40 = (char *)malloc(0x50);
  if (local_40 == (char *)0x0) {
    pFStackY_60 = (FILE *)0x1043af;
    pull_by_name_cold_5();
  }
  else {
    pFStackY_60 = (FILE *)0x104169;
    iVar2 = getl(&local_40,names_fp);
    if (iVar2 != -1) {
      unaff_R12 = &local_40;
      do {
        pFStackY_60 = (FILE *)0x10417d;
        pcVar3 = parse_name(local_40);
        if (pcVar3 != (char *)0x0) {
          pFStackY_60 = (FILE *)0x10418a;
          add_name(pcVar3);
        }
        pFStackY_60 = (FILE *)0x104195;
        iVar2 = getl(unaff_R12,names_fp);
      } while (iVar2 != -1);
    }
    pFStackY_60 = (FILE *)0x1041a4;
    free(local_40);
    if (verbose_flag != 0) {
      pFStackY_60 = (FILE *)0x104384;
      pull_by_name_cold_1();
    }
    pFStackY_60 = (FILE *)0x1041c4;
    local_38 = (gzFile)gzopen(input_file);
    if (local_38 != (gzFile)0x0) {
      pFStackY_60 = (FILE *)0x1041df;
      seq = (kseq_t *)calloc(1,0x70);
      pFStackY_60 = (FILE *)0x1041f1;
      pkVar4 = (kstream_t *)calloc(1,0x20);
      pkVar4->f = local_38;
      pFStackY_60 = (FILE *)0x104202;
      puVar5 = (uchar *)malloc(0xffff);
      pkVar4->buf = puVar5;
      seq->f = pkVar4;
      pFStackY_60 = (FILE *)0x104212;
      kseq_read(seq);
      pcVar3 = (seq->qual).s;
      pFStackY_60 = (FILE *)0x10422f;
      gzrewind(local_38);
      pkVar4 = seq->f;
      pkVar4->begin = 0;
      pkVar4->end = 0;
      uVar9 = 0;
      pkVar4->is_eof = 0;
      seq->last_char = 0;
      if (verbose_flag != 0) {
        pFStackY_60 = (FILE *)0x104397;
        pull_by_name_cold_2();
      }
      pFStackY_60 = (FILE *)0x10425a;
      iVar2 = kseq_read(seq);
      uVar8 = 0;
      if (-1 < iVar2) {
        uVar8 = 0;
        uVar9 = 0;
        do {
          if (exclude == 0) {
            pFStackY_60 = (FILE *)0x104296;
            plVar6 = find_name((seq->name).s);
            if (plVar6 != (lookup_t *)0x0) goto LAB_0010429b;
LAB_00104287:
            uVar9 = uVar9 + 1;
          }
          else {
            pFStackY_60 = (FILE *)0x104282;
            plVar6 = find_name((seq->name).s);
            if (plVar6 != (lookup_t *)0x0) goto LAB_00104287;
LAB_0010429b:
            pFStackY_60 = (FILE *)0x1042bd;
            iVar2 = size_filter(seq,(uint)(pcVar3 == (char *)0x0),min,max,length,convert,just_count)
            ;
            uVar8 = uVar8 + iVar2;
          }
          pFStackY_60 = (FILE *)0x1042c7;
          iVar2 = kseq_read(seq);
        } while (-1 < iVar2);
      }
      if (seq != (kseq_t *)0x0) {
        pFStackY_60 = (FILE *)0x1042da;
        free((seq->name).s);
        pFStackY_60 = (FILE *)0x1042e4;
        free((seq->comment).s);
        pFStackY_60 = (FILE *)0x1042ee;
        free((seq->seq).s);
        pFStackY_60 = (FILE *)0x1042f8;
        free((seq->qual).s);
        pkVar4 = seq->f;
        if (pkVar4 != (kstream_t *)0x0) {
          pFStackY_60 = (FILE *)0x10430a;
          free(pkVar4->buf);
          pFStackY_60 = (FILE *)0x104312;
          free(pkVar4);
        }
        pFStackY_60 = (FILE *)0x10431a;
        free(seq);
      }
      pFStackY_60 = (FILE *)0x104324;
      gzclose(local_38);
      pFStackY_60 = (FILE *)0x104329;
      delete_hash();
      if (just_count != 0) {
        pFStackY_60 = (FILE *)0x10434a;
        fprintf(_stdout,"Total output: %i\n",(ulong)uVar8);
        if (exclude != 0) {
          pFStackY_60 = (FILE *)0x104362;
          fprintf(_stdout,"Total excluded: %i\n",(ulong)uVar9);
        }
      }
      if (verbose_flag != 0) {
        pFStackY_60 = (FILE *)0x1043a8;
        pull_by_name_cold_3();
      }
      return uVar8;
    }
  }
  pFStackY_60 = (FILE *)kseq_read;
  str_00 = (kstring_t *)input_file;
  pull_by_name_cold_4();
  pkVar4 = (kstream_t *)str_00[4].m;
  uStackY_78 = (ulong)(uint)exclude;
  ppcStackY_70 = unaff_R12;
  pcStackY_68 = input_file;
  pFStackY_60 = names_fp;
  uStackY_7c = extraout_var;
  if ((int)str_00[4].l == 0) {
    do {
      if ((pkVar4->is_eof == 0) || (uVar9 = 0xffffffff, pkVar4->begin < pkVar4->end)) {
        if (pkVar4->end <= pkVar4->begin) {
          pkVar4->begin = 0;
          iVar2 = gzread(pkVar4->f,pkVar4->buf,0xffff);
          pkVar4->end = iVar2;
          if (iVar2 == 0) {
            pkVar4->is_eof = 1;
            uVar9 = 0xffffffff;
            goto LAB_00104440;
          }
        }
        iVar2 = pkVar4->begin;
        pkVar4->begin = iVar2 + 1;
        uVar9 = (uint)pkVar4->buf[iVar2];
      }
LAB_00104440:
      if (uVar9 == 0xffffffff) {
        return -1;
      }
      uStackY_7c = uVar9;
    } while ((uVar9 != 0x40) && (uVar9 != 0x3e));
    *(uint *)&str_00[4].l = uVar9;
  }
  str_00[3].l = 0;
  str_00[2].l = 0;
  str_00[1].l = 0;
  iVar2 = ks_getuntil2(pkVar4,0,str_00,(int *)&uStackY_7c,0);
  if (iVar2 < 0) {
    iVar2 = -1;
  }
  else {
    if (uStackY_7c != 10) {
      ks_getuntil2(pkVar4,2,str_00 + 1,(int *)0x0,0);
    }
    if (str_00[2].s == (char *)0x0) {
      str_00[2].m = 0x100;
      pcVar3 = (char *)malloc(0x100);
      str_00[2].s = pcVar3;
    }
    str = str_00 + 2;
LAB_001044be:
    if ((pkVar4->is_eof == 0) || (uVar9 = 0xffffffff, pkVar4->begin < pkVar4->end)) {
      if (pkVar4->end <= pkVar4->begin) {
        pkVar4->begin = 0;
        iVar2 = gzread(pkVar4->f,pkVar4->buf,0xffff);
        pkVar4->end = iVar2;
        if (iVar2 == 0) {
          pkVar4->is_eof = 1;
          uVar9 = 0xffffffff;
          goto LAB_00104511;
        }
      }
      iVar2 = pkVar4->begin;
      pkVar4->begin = iVar2 + 1;
      uVar9 = (uint)pkVar4->buf[iVar2];
    }
LAB_00104511:
    uStackY_7c = uVar9;
    if ((int)uVar9 < 0x2b) goto code_r0x0010451a;
    if (uVar9 != 0x2b) {
      if ((uVar9 != 0x3e) && (uVar9 != 0x40)) goto LAB_00104535;
      *(uint *)&str_00[4].l = uVar9;
    }
LAB_00104581:
    uVar7 = str_00[2].l + 1;
    if (str_00[2].m <= uVar7) {
      uVar7 = uVar7 >> 1 | uVar7;
      uVar7 = uVar7 >> 2 | uVar7;
      uVar7 = uVar7 >> 4 | uVar7;
      uVar7 = uVar7 >> 8 | uVar7;
      __size = (uVar7 >> 0x10 | uVar7) + 1;
      str_00[2].m = __size;
      pcVar3 = (char *)realloc(str_00[2].s,__size);
      str_00[2].s = pcVar3;
    }
    str_00[2].s[str_00[2].l] = '\0';
    if (uStackY_7c == 0x2b) {
      uVar7 = str_00[2].m;
      if (str_00[3].m < uVar7) {
        str_00[3].m = uVar7;
        pcVar3 = (char *)realloc(str_00[3].s,uVar7);
        str_00[3].s = pcVar3;
      }
      do {
        if ((pkVar4->is_eof == 0) || (uVar9 = 0xffffffff, pkVar4->begin < pkVar4->end)) {
          if (pkVar4->end <= pkVar4->begin) {
            pkVar4->begin = 0;
            iVar2 = gzread(pkVar4->f,pkVar4->buf,0xffff);
            pkVar4->end = iVar2;
            if (iVar2 == 0) {
              pkVar4->is_eof = 1;
              uVar9 = 0xffffffff;
              goto LAB_00104669;
            }
          }
          iVar2 = pkVar4->begin;
          pkVar4->begin = iVar2 + 1;
          uVar9 = (uint)pkVar4->buf[iVar2];
        }
LAB_00104669:
        if (uVar9 == 0xffffffff) {
          return -2;
        }
        uStackY_7c = uVar9;
      } while (uVar9 != 10);
      uStackY_7c = 10;
      do {
        iVar2 = ks_getuntil2(pkVar4,2,str_00 + 3,(int *)0x0,1);
        if (iVar2 < 0) break;
      } while (str_00[3].l < str->l);
      *(undefined4 *)&str_00[4].l = 0;
      iVar2 = -2;
      if (str_00[2].l == str_00[3].l) {
        iVar2 = (int)str_00[2].l;
      }
    }
    else {
      iVar2 = (int)str->l;
    }
  }
  return iVar2;
code_r0x0010451a:
  if (uVar9 != 10) {
    if (uVar9 == 0xffffffff) goto LAB_00104581;
LAB_00104535:
    sVar1 = str_00[2].l;
    str_00[2].l = sVar1 + 1;
    str_00[2].s[sVar1] = (char)uVar9;
    ks_getuntil2(pkVar4,2,str,(int *)0x0,1);
  }
  goto LAB_001044be;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_name(char *input_file, FILE *names_fp, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int i,l,capacity=80;
	int count=0,excluded=0;
	int is_fasta = -1;
	char *fasta_name;
	char *line;
	kseq_t *seq;

	/* get some space for the line */
	line = malloc(sizeof(char) * capacity); /* get memory allocated */
	if (!line) {
		fprintf(stderr, "%s - line malloc: %s\n",progname, strerror(errno));
		exit(EXIT_FAILURE);
	}

	while((i = getl(&line, names_fp)) != -1) {
		fasta_name = parse_name(line);
		if (fasta_name) {
			add_name(fasta_name);             /* add fasta_name to hash */
		}
	}

	free(line); /* free up line */

	if (verbose_flag) {
		fprintf(stderr,"\n");
		fprintf(stderr,"done reading from input (%d entries)\n", hash_key_count());
	}
	/*print_hash();*/


	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); /* rewind to beginning for main loop */
	kseq_rewind(seq);

	if (verbose_flag) {
		if (is_fasta)
			fprintf(stderr, "Input is FASTA format\n");
		else
			fprintf(stderr, "Input is FASTQ format\n");
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude == 0) { /* INCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			else
				excluded++;
		} else { /* EXCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				excluded++;
			else
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
		}
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	delete_hash(); /* free the list nodes */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		if (exclude)
			fprintf(stdout, "Total excluded: %i\n", excluded);
	}

	if (verbose_flag) {
		fprintf(stderr,"Processed %i entries\n",count);
		if (exclude)
			fprintf(stderr,"Excluded %i entries\n",excluded);
	}
	return count;
}